

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::internal::
specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::on_dynamic_width<unsigned_int>
          (specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
           *this,uint arg_id)

{
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *this_00;
  basic_format_specs<char> *pbVar1;
  type tVar2;
  format_error *this_01;
  error_handler local_61;
  width_checker<fmt::v5::internal::error_handler> local_60;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  this_00 = this->context_;
  if ((this_00->
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
      ).parse_context_.next_arg_id_ < 1) {
    pbVar1 = (this->super_specs_setter<char>).specs_;
    (this_00->
    super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
    ).parse_context_.next_arg_id_ = -1;
    context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
    ::do_get_arg((format_arg *)&local_58.string,
                 &this_00->
                  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                 ,arg_id);
    local_28 = local_48;
    uStack_20 = uStack_40;
    local_38.long_long_value = local_58.long_long_value;
    local_38.string.size = local_58.string.size;
    local_60.handler_ = &local_61;
    tVar2 = visit<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                      (&local_60,
                       (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                        *)&local_38.string);
    if ((tVar2 & 0xffffffff80000000) == 0) {
      (pbVar1->super_align_spec).width_ = (uint)tVar2;
      return;
    }
    this_01 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this_01,"number is too big");
  }
  else {
    this_01 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this_01,"cannot switch from automatic to manual argument indexing");
  }
  __cxa_throw(this_01,&format_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FMT_CONSTEXPR void on_dynamic_width(Id arg_id) {
    set_dynamic_spec<width_checker>(
          this->specs_.width_, get_arg(arg_id), context_.error_handler());
  }